

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QString,RCCFileInfo*>::emplace_helper<RCCFileInfo*>
          (iterator *__return_storage_ptr__,void *this,QString *key,RCCFileInfo **args)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  undefined8 *puVar7;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_>::findOrInsert<QString>
            ((InsertionResult *)local_58,*this,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    puVar7 = (undefined8 *)operator_new(0x10);
    *puVar7 = *args;
    puVar7[1] = 0;
    pDVar4 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)pEVar2[bVar1].storage.data = pDVar4;
    pcVar5 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    *(char16_t **)(pEVar2[bVar1].storage.data + 8) = pcVar5;
    qVar6 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(pEVar2[bVar1].storage.data + 0x10) = qVar6;
    *(undefined8 **)(pEVar2[bVar1].storage.data + 0x18) = puVar7;
  }
  else {
    puVar7 = (undefined8 *)operator_new(0x10);
    *puVar7 = *args;
    uVar3 = *(undefined8 *)(pEVar2[bVar1].storage.data + 0x18);
    *(undefined8 **)(pEVar2[bVar1].storage.data + 0x18) = puVar7;
    puVar7[1] = uVar3;
  }
  *(long *)((long)this + 8) = *(long *)((long)this + 8) + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *)local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *)local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<QString,_RCCFileInfo_*>_> *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }